

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a3d2::ARTKeyEncodeDecodeTest_EncodeTextC0022_Test::
ARTKeyEncodeDecodeTest_EncodeTextC0022_Test(ARTKeyEncodeDecodeTest_EncodeTextC0022_Test *this)

{
  ARTKeyEncodeDecodeTest_EncodeTextC0022_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ARTKeyEncodeDecodeTest_EncodeTextC0022_Test_001c8a00;
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, EncodeTextC0022) {
  key_factory fac;
  unodb::key_encoder enc;
  // Use std::array rather than "C" strings since the nul would
  // otherwise be interpreted as the end of the C string.
  constexpr auto a1 = std::array<const std::byte, 5>{
      std::byte{'b'}, std::byte{'r'}, std::byte{0}, std::byte{'w'},
      std::byte{'n'}};
  using S = std::span<const std::byte>;
  const auto k1 = fac.make_key_view(enc.reset().encode_text(S(a1)));
  UNODB_EXPECT_EQ(k1.size_bytes(),
                  a1.size() + 1 + sizeof(unodb::key_encoder::size_type));
#ifndef NDEBUG
  std::cerr << "k1=";
  unodb::detail::dump_key(std::cerr, k1);
  std::cerr << "\n";
#endif
}